

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::InsertLocalMinimaIntoAEL(Clipper *this,cInt botY)

{
  TEdge *edge;
  TEdge *edge_00;
  Join *pJVar1;
  long lVar2;
  long lVar3;
  TEdge *e;
  int iVar4;
  bool bVar5;
  long *plVar6;
  OutPt *op2;
  pointer ppJVar7;
  OutPt *pOVar8;
  _func_int *p_Var9;
  pointer ppJVar10;
  size_type i;
  ulong uVar11;
  TEdge **ppTVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  TEdge *pTVar17;
  IntPoint OffPt;
  cInt local_48;
  TEdge **local_40;
  long local_38;
  
  p_Var9 = this->_vptr_Clipper[-3];
  plVar6 = *(long **)(p_Var9 + (long)&(this->m_Joins).
                                      super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                     );
  if (plVar6 != *(long **)(p_Var9 + 0x10 +
                          (long)&(this->m_Joins).
                                 super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                          )) {
    ppTVar12 = &this->m_SortedEdges;
    p_Var9 = p_Var9 + (long)&(this->m_Joins).
                             super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
    ;
    local_40 = ppTVar12;
    local_38 = botY;
    do {
      if (*plVar6 != local_38) {
        return;
      }
      *(long **)p_Var9 = plVar6 + 3;
      edge = (TEdge *)plVar6[1];
      edge_00 = (TEdge *)plVar6[2];
      if (edge == (TEdge *)0x0) {
        InsertEdgeIntoAEL(this,edge_00,(TEdge *)0x0);
        SetWindingCount(this,edge_00);
        bVar5 = IsContributing(this,edge_00);
        op2 = (OutPt *)0x0;
        if (bVar5) {
          op2 = AddOutPt(this,edge_00,(IntPoint *)edge_00);
        }
        if (edge_00 != (TEdge *)0x0) goto LAB_00110079;
      }
      else {
        InsertEdgeIntoAEL(this,edge,(TEdge *)0x0);
        if (edge_00 == (TEdge *)0x0) {
          SetWindingCount(this,edge);
          bVar5 = IsContributing(this,edge);
          if (bVar5) {
            AddOutPt(this,edge,(IntPoint *)edge);
          }
          local_48 = (edge->Top).Y;
          std::
          priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
          ::push((priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
                  *)(this->_vptr_Clipper[-3] + (long)ppTVar12),&local_48);
        }
        else {
          InsertEdgeIntoAEL(this,edge_00,edge);
          SetWindingCount(this,edge);
          iVar4 = edge->WindCnt2;
          edge_00->WindCnt = edge->WindCnt;
          edge_00->WindCnt2 = iVar4;
          bVar5 = IsContributing(this,edge);
          if (bVar5) {
            op2 = AddLocalMinPoly(this,edge,edge_00,(IntPoint *)edge);
          }
          else {
            op2 = (OutPt *)0x0;
          }
          local_48 = (edge->Top).Y;
          std::
          priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
          ::push((priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
                  *)(this->_vptr_Clipper[-3] + (long)ppTVar12),&local_48);
LAB_00110079:
          if ((edge_00->Dx != -1e+40) || (NAN(edge_00->Dx))) {
            local_48 = (edge_00->Top).Y;
            p_Var9 = this->_vptr_Clipper[-3];
LAB_001100dd:
            std::
            priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
            ::push((priority_queue<long_long,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<long_long>_>
                    *)(p_Var9 + (long)ppTVar12),&local_48);
          }
          else {
            pTVar17 = *ppTVar12;
            edge_00->PrevInSEL = (TEdge *)0x0;
            if (pTVar17 != (TEdge *)0x0) {
              pTVar17->PrevInSEL = edge_00;
            }
            *ppTVar12 = edge_00;
            edge_00->NextInSEL = pTVar17;
            if (edge_00->NextInLML != (TEdge *)0x0) {
              local_48 = (edge_00->NextInLML->Top).Y;
              p_Var9 = this->_vptr_Clipper[-3];
              goto LAB_001100dd;
            }
          }
          if (edge != (TEdge *)0x0) {
            if (((op2 != (OutPt *)0x0) && (edge_00->Dx == -1e+40)) && (!NAN(edge_00->Dx))) {
              ppJVar7 = (this->m_GhostJoins).
                        super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              ppJVar10 = (this->m_GhostJoins).
                         super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              if ((ppJVar10 != ppJVar7) && (edge_00->WindDelta != 0)) {
                uVar11 = 0;
                do {
                  pJVar1 = ppJVar7[uVar11];
                  lVar2 = (pJVar1->OffPt).X;
                  lVar13 = (pJVar1->OutPt1->Pt).X;
                  lVar3 = (edge_00->Bot).X;
                  lVar15 = (edge_00->Top).X;
                  lVar16 = lVar2;
                  if (lVar13 < lVar2) {
                    lVar16 = lVar13;
                  }
                  if (lVar13 <= lVar2) {
                    lVar13 = lVar2;
                  }
                  lVar14 = lVar15;
                  if (lVar3 < lVar15) {
                    lVar14 = lVar3;
                  }
                  if (lVar15 < lVar3) {
                    lVar15 = lVar3;
                  }
                  if ((lVar16 < lVar15) && (lVar14 < lVar13)) {
                    OffPt.Y = (pJVar1->OffPt).Y;
                    OffPt.X = lVar2;
                    AddJoin(this,pJVar1->OutPt1,op2,OffPt);
                    ppJVar7 = (this->m_GhostJoins).
                              super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    ppJVar10 = (this->m_GhostJoins).
                               super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  uVar11 = uVar11 + 1;
                } while (uVar11 < (ulong)((long)ppJVar10 - (long)ppJVar7 >> 3));
              }
            }
            if (((((-1 < edge->OutIdx) && (pTVar17 = edge->PrevInAEL, pTVar17 != (TEdge *)0x0)) &&
                 ((pTVar17->Curr).X == (edge->Bot).X)) &&
                ((-1 < pTVar17->OutIdx &&
                 (bVar5 = SlopesEqual(pTVar17->Bot,pTVar17->Top,edge->Curr,edge->Top,
                                      (bool)(this->_vptr_Clipper[-3] + 8)
                                            [(long)&(this->m_GhostJoins).
                                                                                                        
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                            ]), bVar5)))) &&
               ((edge->WindDelta != 0 && (pTVar17->WindDelta != 0)))) {
              pOVar8 = AddOutPt(this,pTVar17,(IntPoint *)edge);
              AddJoin(this,op2,pOVar8,edge->Top);
            }
            pTVar17 = edge->NextInAEL;
            ppTVar12 = local_40;
            if (pTVar17 != edge_00) {
              if (((-1 < edge_00->OutIdx) && (e = edge_00->PrevInAEL, -1 < e->OutIdx)) &&
                 ((bVar5 = SlopesEqual(e->Curr,e->Top,edge_00->Curr,edge_00->Top,
                                       (bool)(this->_vptr_Clipper[-3] + 8)
                                             [(long)&(this->m_GhostJoins).
                                                                                                          
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                             ]), bVar5 &&
                  ((edge_00->WindDelta != 0 && (e->WindDelta != 0)))))) {
                pOVar8 = AddOutPt(this,e,(IntPoint *)edge_00);
                AddJoin(this,op2,pOVar8,edge_00->Top);
                pTVar17 = edge->NextInAEL;
              }
              ppTVar12 = local_40;
              if ((pTVar17 != (TEdge *)0x0) && (pTVar17 != edge_00)) {
                do {
                  IntersectEdges(this,edge_00,pTVar17,&edge->Curr);
                  pTVar17 = pTVar17->NextInAEL;
                } while (pTVar17 != edge_00);
              }
            }
          }
        }
      }
      p_Var9 = this->_vptr_Clipper[-3] +
               (long)&(this->m_Joins).
                      super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>;
      plVar6 = *(long **)p_Var9;
    } while (plVar6 != *(long **)(this->_vptr_Clipper[-3] + 0x10 +
                                 (long)&(this->m_Joins).
                                        super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                 ));
  }
  return;
}

Assistant:

void Clipper::InsertLocalMinimaIntoAEL(const cInt botY)
{
  const LocalMinimum *lm;
  while (PopLocalMinima(botY, lm))
  {
    TEdge* lb = lm->LeftBound;
    TEdge* rb = lm->RightBound;
    
    OutPt *Op1 = 0;
    if (!lb)
    {
      //nb: don't insert LB into either AEL or SEL
      InsertEdgeIntoAEL(rb, 0);
      SetWindingCount(*rb);
      if (IsContributing(*rb))
        Op1 = AddOutPt(rb, rb->Bot); 
    } 
    else if (!rb)
    {
      InsertEdgeIntoAEL(lb, 0);
      SetWindingCount(*lb);
      if (IsContributing(*lb))
        Op1 = AddOutPt(lb, lb->Bot);
      InsertScanbeam(lb->Top.Y);
    }
    else
    {
      InsertEdgeIntoAEL(lb, 0);
      InsertEdgeIntoAEL(rb, lb);
      SetWindingCount( *lb );
      rb->WindCnt = lb->WindCnt;
      rb->WindCnt2 = lb->WindCnt2;
      if (IsContributing(*lb))
        Op1 = AddLocalMinPoly(lb, rb, lb->Bot);      
      InsertScanbeam(lb->Top.Y);
    }

     if (rb)
     {
		 if (IsHorizontal(*rb))
		 {
			 AddEdgeToSEL(rb);
			 if (rb->NextInLML) 
				 InsertScanbeam(rb->NextInLML->Top.Y);
		 }
		 else InsertScanbeam( rb->Top.Y );
     }

    if (!lb || !rb) continue;

    //if any output polygons share an edge, they'll need joining later ...
    if (Op1 && IsHorizontal(*rb) && 
      m_GhostJoins.size() > 0 && (rb->WindDelta != 0))
    {
      for (JoinList::size_type i = 0; i < m_GhostJoins.size(); ++i)
      {
        Join* jr = m_GhostJoins[i];
        //if the horizontal Rb and a 'ghost' horizontal overlap, then convert
        //the 'ghost' join to a real join ready for later ...
        if (HorzSegmentsOverlap(jr->OutPt1->Pt.X, jr->OffPt.X, rb->Bot.X, rb->Top.X))
          AddJoin(jr->OutPt1, Op1, jr->OffPt);
      }
    }

    if (lb->OutIdx >= 0 && lb->PrevInAEL && 
      lb->PrevInAEL->Curr.X == lb->Bot.X &&
      lb->PrevInAEL->OutIdx >= 0 &&
      SlopesEqual(lb->PrevInAEL->Bot, lb->PrevInAEL->Top, lb->Curr, lb->Top, m_UseFullRange) &&
      (lb->WindDelta != 0) && (lb->PrevInAEL->WindDelta != 0))
    {
        OutPt *Op2 = AddOutPt(lb->PrevInAEL, lb->Bot);
        AddJoin(Op1, Op2, lb->Top);
    }

    if(lb->NextInAEL != rb)
    {

      if (rb->OutIdx >= 0 && rb->PrevInAEL->OutIdx >= 0 &&
        SlopesEqual(rb->PrevInAEL->Curr, rb->PrevInAEL->Top, rb->Curr, rb->Top, m_UseFullRange) &&
        (rb->WindDelta != 0) && (rb->PrevInAEL->WindDelta != 0))
      {
          OutPt *Op2 = AddOutPt(rb->PrevInAEL, rb->Bot);
          AddJoin(Op1, Op2, rb->Top);
      }

      TEdge* e = lb->NextInAEL;
      if (e)
      {
        while( e != rb )
        {
          //nb: For calculating winding counts etc, IntersectEdges() assumes
          //that param1 will be to the Right of param2 ABOVE the intersection ...
          IntersectEdges(rb , e , lb->Curr); //order important here
          e = e->NextInAEL;
        }
      }
    }
    
  }
}